

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int filevisit(int f,int n)

{
  int iVar1;
  char *pcVar2;
  buffer *bp;
  char local_428 [8];
  char fname [1024];
  
  iVar1 = getbufcwd(local_428,0x400);
  if (iVar1 != 1) {
    local_428[0] = '\0';
  }
  pcVar2 = eread("Find file: ",local_428,0x400,0x3c);
  if (pcVar2 == (char *)0x0) {
    return 2;
  }
  if ((*pcVar2 != '\0') && (pcVar2 = adjustname(local_428,1), pcVar2 != (char *)0x0)) {
    iVar1 = fisdir(pcVar2);
    if (iVar1 == 1) {
      iVar1 = do_dired(pcVar2);
      return iVar1;
    }
    bp = findbuffer(pcVar2);
    if ((bp != (buffer *)0x0) && (curbp = bp, iVar1 = showbuffer(bp,curwp,8), iVar1 == 1)) {
      if (bp->b_fname[0] != '\0') {
        return 1;
      }
      iVar1 = readin(pcVar2);
      if (iVar1 != 0) {
        return 1;
      }
      killbuffer(bp);
    }
  }
  return 0;
}

Assistant:

int
filevisit(int f, int n)
{
	struct buffer	*bp;
	char	 fname[NFILEN], *bufp, *adjf;
	int	 status;

	if (getbufcwd(fname, sizeof(fname)) != TRUE)
		fname[0] = '\0';
	bufp = eread("Find file: ", fname, NFILEN,
	    EFNEW | EFCR | EFFILE | EFDEF);
	if (bufp == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	adjf = adjustname(fname, TRUE);
	if (adjf == NULL)
		return (FALSE);
	if (fisdir(adjf) == TRUE)
		return (do_dired(adjf));
	if ((bp = findbuffer(adjf)) == NULL)
		return (FALSE);
	curbp = bp;
	if (showbuffer(bp, curwp, WFFULL) != TRUE)
		return (FALSE);
	if (bp->b_fname[0] == '\0') {
		if ((status = readin(adjf)) != TRUE)
			killbuffer(bp);
		return (status);
	}
	return (TRUE);
}